

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseElementContentDecl(xmlParserCtxtPtr ctxt,xmlChar *name,xmlElementContentPtr *result)

{
  int inputchk;
  int local_38;
  int res;
  int inputid;
  xmlElementContentPtr tree;
  xmlElementContentPtr *result_local;
  xmlChar *name_local;
  xmlParserCtxtPtr ctxt_local;
  
  inputchk = ctxt->input->id;
  *result = (xmlElementContentPtr)0x0;
  if (*ctxt->input->cur == '(') {
    xmlNextChar(ctxt);
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    if ((((*ctxt->input->cur == '#') && (ctxt->input->cur[1] == 'P')) &&
        (ctxt->input->cur[2] == 'C')) &&
       (((ctxt->input->cur[3] == 'D' && (ctxt->input->cur[4] == 'A')) &&
        ((ctxt->input->cur[5] == 'T' && (ctxt->input->cur[6] == 'A')))))) {
      _res = xmlParseElementMixedContentDecl(ctxt,inputchk);
      local_38 = 3;
    }
    else {
      _res = xmlParseElementChildrenContentDeclPriv(ctxt,inputchk,1);
      local_38 = 4;
    }
    xmlSkipBlankCharsPE(ctxt);
    *result = _res;
    ctxt_local._4_4_ = local_38;
  }
  else {
    xmlFatalErrMsgStr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,
                      "xmlParseElementContentDecl : %s \'(\' expected\n",name);
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseElementContentDecl(xmlParserCtxtPtr ctxt, const xmlChar *name,
                           xmlElementContentPtr *result) {

    xmlElementContentPtr tree = NULL;
    int inputid = ctxt->input->id;
    int res;

    *result = NULL;

    if (RAW != '(') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
		"xmlParseElementContentDecl : %s '(' expected\n", name);
	return(-1);
    }
    NEXT;
    GROW;
    SKIP_BLANKS_PE;
    if (CMP7(CUR_PTR, '#', 'P', 'C', 'D', 'A', 'T', 'A')) {
        tree = xmlParseElementMixedContentDecl(ctxt, inputid);
	res = XML_ELEMENT_TYPE_MIXED;
    } else {
        tree = xmlParseElementChildrenContentDeclPriv(ctxt, inputid, 1);
	res = XML_ELEMENT_TYPE_ELEMENT;
    }
    SKIP_BLANKS_PE;
    *result = tree;
    return(res);
}